

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumValueDescriptor * __thiscall
google::protobuf::Descriptor::FindEnumValueByName(Descriptor *this,string_view name)

{
  SymbolT SVar1;
  
  SVar1 = FileDescriptorTables::
          FindNestedSymbol<google::protobuf::(anonymous_namespace)::ParentNameQuery>
                    (this->file_->tables_,this,name);
  if ((SVar1.ptr_)->symbol_type_ != '\x05') {
    if ((SVar1.ptr_)->symbol_type_ == '\x06') {
      SVar1.ptr_ = SVar1.ptr_ + -1;
    }
    else {
      SVar1.ptr_ = (SymbolBase *)0x0;
    }
  }
  return (EnumValueDescriptor *)SVar1.ptr_;
}

Assistant:

const EnumValueDescriptor* Descriptor::FindEnumValueByName(
    absl::string_view name) const {
  return file()->tables_->FindNestedSymbol(this, name).enum_value_descriptor();
}